

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O3

int __thiscall
CVmObjLookupTable::set_index_val_q
          (CVmObjLookupTable *this,vm_val_t *new_container,vm_obj_id_t self,vm_val_t *index_val,
          vm_val_t *new_val)

{
  anon_union_8_8_cb74652f_for_val aVar1;
  undefined4 uVar2;
  vm_lookup_val *key;
  CVmObjLookupTable *this_00;
  
  this_00 = this;
  key = find_entry(this,index_val,(uint *)0x0,(vm_lookup_val **)0x0);
  if (key == (vm_lookup_val *)0x0) {
    add_undo_rec(this_00,self,LOOKUPTAB_UNDO_ADD,index_val,(vm_val_t *)0x0);
    add_entry(this,index_val,new_val);
  }
  else {
    add_undo_rec(this_00,self,LOOKUPTAB_UNDO_MOD,&key->key,&key->val);
    uVar2 = *(undefined4 *)&new_val->field_0x4;
    aVar1 = new_val->val;
    (key->val).typ = new_val->typ;
    *(undefined4 *)&(key->val).field_0x4 = uVar2;
    (key->val).val = aVar1;
  }
  new_container->typ = VM_OBJ;
  (new_container->val).obj = self;
  return 1;
}

Assistant:

int CVmObjLookupTable::set_index_val_q(VMG_ vm_val_t *new_container,
                                       vm_obj_id_t self,
                                       const vm_val_t *index_val,
                                       const vm_val_t *new_val)
{
    vm_lookup_val *entry;
    
    /* look for an existing entry with this key */
    entry = find_entry(vmg_ index_val, 0, 0);

    /* if we found an existing entry, modify it; otherwise, add a new one */
    if (entry != 0)
    {   
        /* set the new value for this entry */
        set_entry_val_undo(vmg_ self, entry, new_val);
    }
    else
    {
        /* add a new entry with the given key */
        add_entry_undo(vmg_ self, index_val, new_val);
    }

    /* we can be modified, hence the new container is the original one */
    new_container->set_obj(self);

    /* handled */
    return TRUE;
}